

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Sigmoid_x86_fma::forward_inplace(Sigmoid_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [24];
  undefined1 auVar43 [16];
  long *in_RSI;
  double dVar44;
  float fVar45;
  float fVar46;
  __m128 _p_1;
  __m128 _zero;
  __m128 _one;
  __m256 _p;
  __m256 _zero_avx;
  __m256 _one_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  undefined8 local_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  int local_1558;
  undefined8 local_1548;
  undefined8 local_1540;
  undefined8 local_1538;
  undefined4 local_1530;
  long local_1528;
  undefined4 local_1520;
  undefined4 local_151c;
  undefined4 local_1518;
  undefined4 local_1514;
  undefined4 local_1510;
  undefined8 local_1508;
  undefined1 (*local_1500) [32];
  int local_14f4;
  int local_14f0;
  int local_14ec;
  int local_14e8;
  int local_14e4;
  int local_14e0;
  int local_14dc;
  long *local_14d0;
  undefined1 local_14bd;
  int local_14bc;
  undefined8 *local_14b0;
  undefined8 *local_14a8;
  undefined8 *local_1498;
  undefined4 local_1484;
  undefined1 local_1480 [32];
  undefined1 (*local_1448) [32];
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 local_13a0 [8];
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [32];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [32];
  undefined1 local_1300 [8];
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  ulong uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 (*local_11a8) [32];
  undefined4 local_11a0;
  undefined4 uStack_119c;
  undefined4 uStack_1198;
  undefined4 uStack_1194;
  undefined4 local_1184;
  undefined1 local_1180 [16];
  undefined1 (*local_1168) [32];
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  undefined8 local_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 local_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined1 local_1110 [8];
  undefined8 uStack_1108;
  undefined1 local_1100 [16];
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined1 local_10e0 [16];
  undefined1 local_10d0 [8];
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined1 local_10b0 [16];
  undefined1 local_10a0 [16];
  undefined8 local_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 local_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 local_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 local_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  ulong uStack_1018;
  undefined8 local_1010;
  undefined8 uStack_1008;
  undefined1 (*local_ff8) [32];
  long local_ff0;
  undefined4 local_fe4;
  long local_fe0;
  undefined1 (*local_fd8) [32];
  undefined4 local_fcc;
  int local_fc8;
  int local_fc4;
  undefined8 *local_fc0;
  undefined4 local_fb4;
  long local_fb0;
  undefined8 *local_f90;
  undefined1 local_f60 [16];
  undefined1 auStack_f50 [16];
  undefined4 local_f40;
  undefined4 local_f3c;
  undefined4 local_f38;
  undefined4 local_f34;
  undefined4 local_f30;
  undefined4 local_f2c;
  undefined4 local_f28;
  undefined4 local_f24;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined1 local_ae0 [32];
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  undefined4 local_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined4 local_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined4 local_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined4 local_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_14dc = *(int *)((long)in_RSI + 0x2c);
  local_14e0 = (int)in_RSI[6];
  local_14e4 = *(int *)((long)in_RSI + 0x34);
  local_14e8 = (int)in_RSI[7];
  local_14ec = (int)in_RSI[3];
  local_14f0 = local_14dc * local_14e0 * local_14e4 * local_14ec;
  local_14d0 = in_RSI;
  for (local_14f4 = 0; local_14f4 < local_14e8; local_14f4 = local_14f4 + 1) {
    local_14b0 = &local_1548;
    local_fc4 = *(int *)((long)local_14d0 + 0x2c);
    local_fc8 = (int)local_14d0[6];
    local_fcc = *(undefined4 *)((long)local_14d0 + 0x34);
    local_fd8 = (undefined1 (*) [32])
                (*local_14d0 + local_14d0[8] * (long)local_14f4 * local_14d0[2]);
    local_fe0 = local_14d0[2];
    local_fe4 = (undefined4)local_14d0[3];
    local_ff0 = local_14d0[4];
    local_fc0 = &local_1548;
    local_fb0 = (long)local_fc4 * (long)local_fc8 * local_fe0;
    local_14a8 = &local_1548;
    local_1498 = &local_1548;
    local_fb4 = 0x10;
    local_14bc = local_14f4;
    local_14bd = 1;
    local_1548 = 0;
    local_1538 = 0;
    local_1530 = 0;
    local_1520 = 0;
    local_151c = 0;
    local_1518 = 0;
    local_1514 = 0;
    local_1510 = 0;
    local_1508 = 0;
    local_1540 = 0;
    local_1558 = 0;
    local_1484 = 0x3f800000;
    local_f24 = 0x3f800000;
    local_f28 = 0x3f800000;
    local_f2c = 0x3f800000;
    local_f30 = 0x3f800000;
    local_f34 = 0x3f800000;
    local_f38 = 0x3f800000;
    local_f3c = 0x3f800000;
    local_f40 = 0x3f800000;
    auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
    local_f60 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
    auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
    auStack_f50 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
    local_1480._8_8_ = SUB328(ZEXT832(0),4);
    local_1500 = local_fd8;
    for (; local_1558 + 7 < local_14f0; local_1558 = local_1558 + 8) {
      local_1448 = local_1500;
      auVar42 = *(undefined1 (*) [24])*local_1500;
      uStack_1208 = *(undefined8 *)(*local_1500 + 0x18);
      local_1420 = local_f60._0_8_;
      uStack_1418 = local_f60._8_8_;
      uStack_1410 = auStack_f50._0_8_;
      uStack_1408 = auStack_f50._8_8_;
      local_1200 = 0;
      uStack_11f8 = local_1480._8_8_;
      uStack_11f0 = 0;
      uStack_11e8 = 0;
      local_15c0 = auVar42._0_8_;
      local_1220 = local_15c0;
      uStack_15b8 = auVar42._8_8_;
      uStack_1218 = uStack_15b8;
      uStack_15b0 = auVar42._16_8_;
      uStack_1210 = uStack_15b0;
      auVar5 = vsubps_avx(ZEXT832((ulong)local_1480._8_8_) << 0x40,*local_1500);
      local_12c0 = ZEXT832(0) << 0x20;
      local_1360 = 0x3f8000003f800000;
      uStack_1358 = 0x3f8000003f800000;
      uStack_1350 = 0x3f8000003f800000;
      uStack_1348 = 0x3f8000003f800000;
      local_12e0._0_8_ = auVar5._0_8_;
      local_f00 = local_12e0._0_8_;
      local_12e0._8_8_ = auVar5._8_8_;
      uStack_ef8 = local_12e0._8_8_;
      local_12e0._16_8_ = auVar5._16_8_;
      uStack_ef0 = local_12e0._16_8_;
      local_12e0._24_8_ = auVar5._24_8_;
      uStack_ee8 = local_12e0._24_8_;
      local_f20 = 0x42b0c0a542b0c0a5;
      uStack_f18 = 0x42b0c0a542b0c0a5;
      uStack_f10 = 0x42b0c0a542b0c0a5;
      uStack_f08 = 0x42b0c0a542b0c0a5;
      auVar4._8_8_ = 0x42b0c0a542b0c0a5;
      auVar4._0_8_ = 0x42b0c0a542b0c0a5;
      auVar4._16_8_ = 0x42b0c0a542b0c0a5;
      auVar4._24_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = vminps_avx(auVar5,auVar4);
      local_12e0._0_8_ = auVar5._0_8_;
      local_ec0 = local_12e0._0_8_;
      local_12e0._8_8_ = auVar5._8_8_;
      uStack_eb8 = local_12e0._8_8_;
      local_12e0._16_8_ = auVar5._16_8_;
      uStack_eb0 = local_12e0._16_8_;
      local_12e0._24_8_ = auVar5._24_8_;
      uStack_ea8 = local_12e0._24_8_;
      local_ee0 = 0xc2b0c0a5c2b0c0a5;
      uStack_ed8 = 0xc2b0c0a5c2b0c0a5;
      uStack_ed0 = 0xc2b0c0a5c2b0c0a5;
      uStack_ec8 = 0xc2b0c0a5c2b0c0a5;
      auVar12._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar12._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar12._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar12._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar5,auVar12);
      local_12e0._0_8_ = auVar3._0_8_;
      local_c20 = local_12e0._0_8_;
      local_12e0._8_8_ = auVar3._8_8_;
      uStack_c18 = local_12e0._8_8_;
      local_12e0._16_8_ = auVar3._16_8_;
      uStack_c10 = local_12e0._16_8_;
      local_12e0._24_8_ = auVar3._24_8_;
      uStack_c08 = local_12e0._24_8_;
      local_c40 = 0x3fb8aa3b3fb8aa3b;
      uStack_c38 = 0x3fb8aa3b3fb8aa3b;
      uStack_c30 = 0x3fb8aa3b3fb8aa3b;
      uStack_c28 = 0x3fb8aa3b3fb8aa3b;
      local_e40 = 0x3f0000003f000000;
      uStack_e38 = 0x3f0000003f000000;
      uStack_e30 = 0x3f0000003f000000;
      uStack_e28 = 0x3f0000003f000000;
      local_840 = local_12e0._0_8_;
      uStack_838 = local_12e0._8_8_;
      uStack_830 = local_12e0._16_8_;
      uStack_828 = local_12e0._24_8_;
      local_860 = 0x3fb8aa3b3fb8aa3b;
      uStack_858 = 0x3fb8aa3b3fb8aa3b;
      uStack_850 = 0x3fb8aa3b3fb8aa3b;
      uStack_848 = 0x3fb8aa3b3fb8aa3b;
      local_880 = 0x3f0000003f000000;
      uStack_878 = 0x3f0000003f000000;
      uStack_870 = 0x3f0000003f000000;
      uStack_868 = 0x3f0000003f000000;
      auVar15._8_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar15._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar15._16_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar15._24_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar14._8_8_ = 0x3f0000003f000000;
      auVar14._0_8_ = 0x3f0000003f000000;
      auVar14._16_8_ = 0x3f0000003f000000;
      auVar14._24_8_ = 0x3f0000003f000000;
      auVar1 = vfmadd213ps_fma(auVar15,auVar3,auVar14);
      auVar4 = vroundps_avx(ZEXT1632(auVar1),1);
      auVar5 = vcmpps_avx(ZEXT1632(auVar1),auVar4,1);
      local_1380._0_8_ = auVar5._0_8_;
      local_be0 = local_1380._0_8_;
      local_1380._8_8_ = auVar5._8_8_;
      uStack_bd8 = local_1380._8_8_;
      local_1380._16_8_ = auVar5._16_8_;
      uStack_bd0 = local_1380._16_8_;
      local_1380._24_8_ = auVar5._24_8_;
      uStack_bc8 = local_1380._24_8_;
      local_c00 = 0x3f8000003f800000;
      uStack_bf8 = 0x3f8000003f800000;
      uStack_bf0 = 0x3f8000003f800000;
      uStack_be8 = 0x3f8000003f800000;
      auVar13._8_8_ = 0x3f8000003f800000;
      auVar13._0_8_ = 0x3f8000003f800000;
      auVar13._16_8_ = 0x3f8000003f800000;
      auVar13._24_8_ = 0x3f8000003f800000;
      local_1380 = vandps_avx(auVar5,auVar13);
      local_1300 = auVar4._0_8_;
      local_1240 = local_1300;
      uStack_12f8 = auVar4._8_8_;
      uStack_1238 = uStack_12f8;
      uStack_12f0 = auVar4._16_8_;
      uStack_1230 = uStack_12f0;
      uStack_12e8 = auVar4._24_8_;
      uStack_1228 = uStack_12e8;
      local_1260 = local_1380._0_8_;
      uStack_1258 = local_1380._8_8_;
      uStack_1250 = local_1380._16_8_;
      uStack_1248 = local_1380._24_8_;
      local_1320 = vsubps_avx(auVar4,local_1380);
      local_b20 = local_1320._0_8_;
      uStack_b18 = local_1320._8_8_;
      uStack_b10 = local_1320._16_8_;
      uStack_b08 = local_1320._24_8_;
      local_b60 = local_12e0._0_8_;
      uStack_b58 = local_12e0._8_8_;
      uStack_b50 = local_12e0._16_8_;
      uStack_b48 = local_12e0._24_8_;
      local_b40 = 0x3f3180003f318000;
      uStack_b38 = 0x3f3180003f318000;
      uStack_b30 = 0x3f3180003f318000;
      uStack_b28 = 0x3f3180003f318000;
      local_5a0 = local_1320._0_8_;
      uStack_598 = local_1320._8_8_;
      uStack_590 = local_1320._16_8_;
      uStack_588 = local_1320._24_8_;
      local_5c0 = 0x3f3180003f318000;
      uStack_5b8 = 0x3f3180003f318000;
      uStack_5b0 = 0x3f3180003f318000;
      uStack_5a8 = 0x3f3180003f318000;
      local_5e0 = local_12e0._0_8_;
      uStack_5d8 = local_12e0._8_8_;
      uStack_5d0 = local_12e0._16_8_;
      uStack_5c8 = local_12e0._24_8_;
      auVar22._8_8_ = 0x3f3180003f318000;
      auVar22._0_8_ = 0x3f3180003f318000;
      auVar22._16_8_ = 0x3f3180003f318000;
      auVar22._24_8_ = 0x3f3180003f318000;
      auVar1 = vfnmadd213ps_fma(auVar22,local_1320,auVar3);
      local_b80 = local_1320._0_8_;
      uStack_b78 = local_1320._8_8_;
      uStack_b70 = local_1320._16_8_;
      uStack_b68 = local_1320._24_8_;
      local_12e0._0_8_ = auVar1._0_8_;
      local_bc0 = local_12e0._0_8_;
      local_12e0._8_8_ = auVar1._8_8_;
      uStack_bb8 = local_12e0._8_8_;
      uStack_bb0 = 0;
      uStack_ba8 = 0;
      local_ba0 = 0xb95e8083b95e8083;
      uStack_b98 = 0xb95e8083b95e8083;
      uStack_b90 = 0xb95e8083b95e8083;
      uStack_b88 = 0xb95e8083b95e8083;
      local_540 = local_1320._0_8_;
      uStack_538 = local_1320._8_8_;
      uStack_530 = local_1320._16_8_;
      uStack_528 = local_1320._24_8_;
      local_560 = 0xb95e8083b95e8083;
      uStack_558 = 0xb95e8083b95e8083;
      uStack_550 = 0xb95e8083b95e8083;
      uStack_548 = 0xb95e8083b95e8083;
      local_580 = local_12e0._0_8_;
      uStack_578 = local_12e0._8_8_;
      uStack_570 = 0;
      uStack_568 = 0;
      auVar23._8_8_ = 0xb95e8083b95e8083;
      auVar23._0_8_ = 0xb95e8083b95e8083;
      auVar23._16_8_ = 0xb95e8083b95e8083;
      auVar23._24_8_ = 0xb95e8083b95e8083;
      auVar6 = vfnmadd213ps_fma(auVar23,local_1320,ZEXT1632(auVar1));
      local_12e0._0_8_ = auVar6._0_8_;
      local_ac0 = local_12e0._0_8_;
      local_12e0._8_8_ = auVar6._8_8_;
      uStack_ab8 = local_12e0._8_8_;
      uStack_ab0 = 0;
      uStack_aa8 = 0;
      local_aa0._0_4_ = auVar6._0_4_;
      local_aa0._4_4_ = auVar6._4_4_;
      uStack_a98._0_4_ = auVar6._8_4_;
      uStack_a98._4_4_ = auVar6._12_4_;
      local_1300._4_4_ = local_aa0._4_4_ * local_aa0._4_4_;
      local_1300._0_4_ = (float)local_aa0 * (float)local_aa0;
      local_e80 = local_1300;
      uStack_12f8._0_4_ = (float)uStack_a98 * (float)uStack_a98;
      uStack_12f8._4_4_ = uStack_a98._4_4_ * uStack_a98._4_4_;
      auVar2 = _local_1300;
      _local_1300 = ZEXT1632(_local_1300);
      auVar12 = _local_1300;
      uStack_1398 = 0x3950696739506967;
      local_13a0 = (undefined1  [8])0x3950696739506967;
      local_c80 = 0x3950696739506967;
      uStack_c78 = 0x3950696739506967;
      uStack_c70 = 0x3950696739506967;
      uStack_c68 = 0x3950696739506967;
      local_ca0 = local_12e0._0_8_;
      uStack_c98 = local_12e0._8_8_;
      uStack_c90 = 0;
      uStack_c88 = 0;
      local_cc0 = 0x3ab743ce3ab743ce;
      uStack_cb8 = 0x3ab743ce3ab743ce;
      uStack_cb0 = 0x3ab743ce3ab743ce;
      uStack_ca8 = 0x3ab743ce3ab743ce;
      local_7e0 = 0x3950696739506967;
      uStack_7d8 = 0x3950696739506967;
      uStack_7d0 = 0x3950696739506967;
      uStack_7c8 = 0x3950696739506967;
      local_800 = local_12e0._0_8_;
      uStack_7f8 = local_12e0._8_8_;
      uStack_7f0 = 0;
      uStack_7e8 = 0;
      local_820 = 0x3ab743ce3ab743ce;
      uStack_818 = 0x3ab743ce3ab743ce;
      uStack_810 = 0x3ab743ce3ab743ce;
      uStack_808 = 0x3ab743ce3ab743ce;
      auVar17._16_8_ = 0x3950696739506967;
      auVar17._0_16_ = _local_13a0;
      auVar17._24_8_ = 0x3950696739506967;
      auVar16._8_8_ = 0x3ab743ce3ab743ce;
      auVar16._0_8_ = 0x3ab743ce3ab743ce;
      auVar16._16_8_ = 0x3ab743ce3ab743ce;
      auVar16._24_8_ = 0x3ab743ce3ab743ce;
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar17,auVar16);
      local_13a0 = auVar1._0_8_;
      local_ce0 = local_13a0;
      uStack_1398 = auVar1._8_8_;
      uStack_cd8 = uStack_1398;
      uStack_cd0 = 0;
      uStack_cc8 = 0;
      local_d00 = local_12e0._0_8_;
      uStack_cf8 = local_12e0._8_8_;
      uStack_cf0 = 0;
      uStack_ce8 = 0;
      local_d20 = 0x3c0889083c088908;
      uStack_d18 = 0x3c0889083c088908;
      uStack_d10 = 0x3c0889083c088908;
      uStack_d08 = 0x3c0889083c088908;
      local_780 = local_13a0;
      uStack_778 = uStack_1398;
      uStack_770 = 0;
      uStack_768 = 0;
      local_7a0 = local_12e0._0_8_;
      uStack_798 = local_12e0._8_8_;
      uStack_790 = 0;
      uStack_788 = 0;
      local_7c0 = 0x3c0889083c088908;
      uStack_7b8 = 0x3c0889083c088908;
      uStack_7b0 = 0x3c0889083c088908;
      uStack_7a8 = 0x3c0889083c088908;
      auVar18._8_8_ = 0x3c0889083c088908;
      auVar18._0_8_ = 0x3c0889083c088908;
      auVar18._16_8_ = 0x3c0889083c088908;
      auVar18._24_8_ = 0x3c0889083c088908;
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar18);
      local_13a0 = auVar1._0_8_;
      local_d40 = local_13a0;
      uStack_1398 = auVar1._8_8_;
      uStack_d38 = uStack_1398;
      uStack_d30 = 0;
      uStack_d28 = 0;
      local_d60 = local_12e0._0_8_;
      uStack_d58 = local_12e0._8_8_;
      uStack_d50 = 0;
      uStack_d48 = 0;
      local_d80 = 0x3d2aa9c13d2aa9c1;
      uStack_d78 = 0x3d2aa9c13d2aa9c1;
      uStack_d70 = 0x3d2aa9c13d2aa9c1;
      uStack_d68 = 0x3d2aa9c13d2aa9c1;
      local_720 = local_13a0;
      uStack_718 = uStack_1398;
      uStack_710 = 0;
      uStack_708 = 0;
      local_740 = local_12e0._0_8_;
      uStack_738 = local_12e0._8_8_;
      uStack_730 = 0;
      uStack_728 = 0;
      local_760 = 0x3d2aa9c13d2aa9c1;
      uStack_758 = 0x3d2aa9c13d2aa9c1;
      uStack_750 = 0x3d2aa9c13d2aa9c1;
      uStack_748 = 0x3d2aa9c13d2aa9c1;
      auVar19._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar19._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar19._16_8_ = 0x3d2aa9c13d2aa9c1;
      auVar19._24_8_ = 0x3d2aa9c13d2aa9c1;
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar19);
      local_13a0 = auVar1._0_8_;
      local_da0 = local_13a0;
      uStack_1398 = auVar1._8_8_;
      uStack_d98 = uStack_1398;
      uStack_d90 = 0;
      uStack_d88 = 0;
      local_dc0 = local_12e0._0_8_;
      uStack_db8 = local_12e0._8_8_;
      uStack_db0 = 0;
      uStack_da8 = 0;
      local_de0 = 0x3e2aaaaa3e2aaaaa;
      uStack_dd8 = 0x3e2aaaaa3e2aaaaa;
      uStack_dd0 = 0x3e2aaaaa3e2aaaaa;
      uStack_dc8 = 0x3e2aaaaa3e2aaaaa;
      local_6c0 = local_13a0;
      uStack_6b8 = uStack_1398;
      uStack_6b0 = 0;
      uStack_6a8 = 0;
      local_6e0 = local_12e0._0_8_;
      uStack_6d8 = local_12e0._8_8_;
      uStack_6d0 = 0;
      uStack_6c8 = 0;
      local_700 = 0x3e2aaaaa3e2aaaaa;
      uStack_6f8 = 0x3e2aaaaa3e2aaaaa;
      uStack_6f0 = 0x3e2aaaaa3e2aaaaa;
      uStack_6e8 = 0x3e2aaaaa3e2aaaaa;
      auVar20._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar20._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar20._16_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar20._24_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar20);
      local_13a0 = auVar1._0_8_;
      local_e00 = local_13a0;
      uStack_1398 = auVar1._8_8_;
      uStack_df8 = uStack_1398;
      uStack_df0 = 0;
      uStack_de8 = 0;
      local_e20 = local_12e0._0_8_;
      uStack_e18 = local_12e0._8_8_;
      uStack_e10 = 0;
      uStack_e08 = 0;
      local_660 = local_13a0;
      uStack_658 = uStack_1398;
      uStack_650 = 0;
      uStack_648 = 0;
      local_680 = local_12e0._0_8_;
      uStack_678 = local_12e0._8_8_;
      uStack_670 = 0;
      uStack_668 = 0;
      local_6a0 = 0x3f0000003f000000;
      uStack_698 = 0x3f0000003f000000;
      uStack_690 = 0x3f0000003f000000;
      uStack_688 = 0x3f0000003f000000;
      auVar21._8_8_ = 0x3f0000003f000000;
      auVar21._0_8_ = 0x3f0000003f000000;
      auVar21._16_8_ = 0x3f0000003f000000;
      auVar21._24_8_ = 0x3f0000003f000000;
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar21);
      local_13a0 = auVar1._0_8_;
      local_e60 = local_13a0;
      uStack_1398 = auVar1._8_8_;
      uStack_e58 = uStack_1398;
      uStack_e50 = 0;
      uStack_e48 = 0;
      uStack_12f8 = auVar2._8_8_;
      uStack_e78 = uStack_12f8;
      uStack_e70 = 0;
      uStack_e68 = 0;
      local_ea0 = local_12e0._0_8_;
      uStack_e98 = local_12e0._8_8_;
      uStack_e90 = 0;
      uStack_e88 = 0;
      local_600 = local_13a0;
      uStack_5f8 = uStack_1398;
      uStack_5f0 = 0;
      uStack_5e8 = 0;
      local_620 = local_e80;
      uStack_618 = uStack_12f8;
      uStack_610 = 0;
      uStack_608 = 0;
      local_640 = local_12e0._0_8_;
      uStack_638 = local_12e0._8_8_;
      uStack_630 = 0;
      uStack_628 = 0;
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar2),ZEXT1632(auVar1),ZEXT1632(auVar6));
      local_13a0 = auVar1._0_8_;
      uVar7 = local_13a0;
      uStack_1398 = auVar1._8_8_;
      uVar8 = uStack_1398;
      uStack_1270 = 0;
      uStack_1268 = 0;
      local_12a0 = 0x3f8000003f800000;
      uStack_1298 = 0x3f8000003f800000;
      uStack_1290 = 0x3f8000003f800000;
      uStack_1288 = 0x3f8000003f800000;
      local_1280._0_4_ = auVar1._0_4_;
      local_1280._4_4_ = auVar1._4_4_;
      uStack_1278._0_4_ = auVar1._8_4_;
      uStack_1278._4_4_ = auVar1._12_4_;
      local_13a0._4_4_ = local_1280._4_4_ + 1.0;
      local_13a0._0_4_ = (float)local_1280 + 1.0;
      uStack_1398._0_4_ = (float)uStack_1278 + 1.0;
      uStack_1398._4_4_ = uStack_1278._4_4_ + 1.0;
      uStack_1390._0_4_ = 0x3f800000;
      uStack_1390._4_4_ = 0x3f800000;
      uStack_1388._0_4_ = 0x3f800000;
      uStack_1388._4_4_ = 0x3f800000;
      local_a80._0_4_ = local_1320._0_4_;
      local_a80._4_4_ = local_1320._4_4_;
      uStack_a78._0_4_ = local_1320._8_4_;
      uStack_a78._4_4_ = local_1320._12_4_;
      uStack_a70._0_4_ = local_1320._16_4_;
      uStack_a70._4_4_ = local_1320._20_4_;
      uStack_a68._0_4_ = local_1320._24_4_;
      uStack_a68._4_4_ = local_1320._28_4_;
      local_1340 = CONCAT44((int)local_a80._4_4_,(int)(float)local_a80);
      uStack_1338 = CONCAT44((int)uStack_a78._4_4_,(int)(float)uStack_a78);
      uStack_1330 = CONCAT44((int)uStack_a70._4_4_,(int)(float)uStack_a70);
      uStack_1328 = CONCAT44((int)uStack_a68._4_4_,(int)(float)uStack_a68);
      local_980 = local_1340;
      uStack_978 = uStack_1338;
      uStack_970 = uStack_1330;
      uStack_968 = uStack_1328;
      local_9a0 = 0x7f0000007f;
      uStack_998 = 0x7f0000007f;
      uStack_990 = 0x7f0000007f;
      uStack_988 = 0x7f0000007f;
      local_a20 = local_1340;
      uStack_a18 = uStack_1338;
      uStack_a10 = uStack_1330;
      uStack_a08 = uStack_1328;
      local_a40 = 0x7f0000007f;
      uStack_a38 = 0x7f0000007f;
      uStack_a30 = 0x7f0000007f;
      uStack_a28 = 0x7f0000007f;
      local_9d0 = 0x7f0000007f;
      uStack_9c8 = 0x7f0000007f;
      local_9e0 = 0x7f0000007f;
      uStack_9d8 = 0x7f0000007f;
      local_4e0 = local_1340;
      uStack_4d8 = uStack_1338;
      local_4f0 = 0x7f0000007f;
      uStack_4e8 = 0x7f0000007f;
      auVar25._8_8_ = uStack_1338;
      auVar25._0_8_ = local_1340;
      auVar24._8_8_ = 0x7f0000007f;
      auVar24._0_8_ = 0x7f0000007f;
      local_9b0 = vpaddd_avx(auVar25,auVar24);
      local_500 = uStack_1330;
      uStack_4f8 = uStack_1328;
      local_510 = 0x7f0000007f;
      uStack_508 = 0x7f0000007f;
      auVar2._8_8_ = uStack_1328;
      auVar2._0_8_ = uStack_1330;
      auVar1._8_8_ = 0x7f0000007f;
      auVar1._0_8_ = 0x7f0000007f;
      local_9c0 = vpaddd_avx(auVar2,auVar1);
      local_a60 = local_9b0._0_8_;
      uStack_a58 = local_9b0._8_8_;
      uStack_a50 = local_9c0._0_8_;
      uStack_a48 = local_9c0._8_8_;
      local_a00 = local_9b0._0_8_;
      uStack_9f8 = local_9b0._8_8_;
      uStack_9f0 = local_9c0._0_8_;
      uStack_9e8 = local_9c0._8_8_;
      local_8c0 = local_9b0._0_8_;
      uStack_8b8 = local_9b0._8_8_;
      uStack_8b0 = local_9c0._0_8_;
      uStack_8a8 = local_9c0._8_8_;
      local_8c4 = 0x17;
      local_940 = local_9b0._0_8_;
      uStack_938 = local_9b0._8_8_;
      uStack_930 = local_9c0._0_8_;
      uStack_928 = local_9c0._8_8_;
      local_480 = local_9b0._0_8_;
      uStack_478 = local_9b0._8_8_;
      local_484 = 0x17;
      local_8e0 = vpslld_avx(local_9b0,ZEXT416(0x17));
      local_4a0 = local_9c0._0_8_;
      uStack_498 = local_9c0._8_8_;
      local_4a4 = 0x17;
      local_8f0 = vpslld_avx(local_9c0,ZEXT416(0x17));
      local_960 = local_8e0._0_8_;
      uStack_958 = local_8e0._8_8_;
      uStack_950 = local_8f0._0_8_;
      uStack_948 = local_8f0._8_8_;
      local_920 = local_8e0._0_8_;
      uStack_918 = local_8e0._8_8_;
      uStack_910 = local_8f0._0_8_;
      uStack_908 = local_8f0._8_8_;
      local_1340 = local_8e0._0_8_;
      uStack_1338 = local_8e0._8_8_;
      uStack_1330 = local_8f0._0_8_;
      uStack_1328 = local_8f0._8_8_;
      local_8a0 = local_8e0._0_8_;
      uStack_898 = local_8e0._8_8_;
      uStack_890 = local_8f0._0_8_;
      uStack_888 = local_8f0._8_8_;
      local_13c0 = local_8e0._0_8_;
      uStack_13b8 = local_8e0._8_8_;
      uStack_13b0 = local_8f0._0_8_;
      uStack_13a8 = local_8f0._8_8_;
      local_ae0 = _local_13a0;
      local_b00._0_4_ = local_8e0._0_4_;
      local_b00._4_4_ = local_8e0._4_4_;
      uStack_af8._0_4_ = local_8e0._8_4_;
      uStack_af8._4_4_ = local_8e0._12_4_;
      uStack_af0._0_4_ = local_8f0._0_4_;
      uStack_af0._4_4_ = local_8f0._4_4_;
      uStack_ae8._0_4_ = local_8f0._8_4_;
      local_13a0._0_4_ = ((float)local_1280 + 1.0) * (float)local_b00;
      local_13a0._4_4_ = (local_1280._4_4_ + 1.0) * local_b00._4_4_;
      uStack_af8._0_4_ = ((float)uStack_1278 + 1.0) * (float)uStack_af8;
      uStack_af8._4_4_ = (uStack_1278._4_4_ + 1.0) * uStack_af8._4_4_;
      uStack_1398._0_4_ = (float)uStack_af8;
      uStack_1398._4_4_ = uStack_af8._4_4_;
      uStack_1390._0_4_ = (float)uStack_af0 * 1.0;
      uStack_1390._4_4_ = uStack_af0._4_4_ * 1.0;
      auVar42 = _local_13a0;
      uStack_1388._0_4_ = (float)uStack_ae8 * 1.0;
      uStack_1388._4_4_ = 0x3f800000;
      auVar4 = _local_13a0;
      local_1400 = local_13a0;
      uStack_13f8 = uStack_1398;
      uStack_1390 = auVar42._16_8_;
      uStack_13f0 = uStack_1390;
      uStack_1388 = auVar4._24_8_;
      uStack_13e8 = uStack_1388;
      local_13e0._0_4_ = local_f60._0_4_;
      local_13e0._4_4_ = local_f60._4_4_;
      uStack_13d8._0_4_ = local_f60._8_4_;
      uStack_13d8._4_4_ = local_f60._12_4_;
      uStack_13d0._0_4_ = auStack_f50._0_4_;
      uStack_13d0._4_4_ = auStack_f50._4_4_;
      uStack_13c8._0_4_ = auStack_f50._8_4_;
      uStack_13c8._4_4_ = auStack_f50._12_4_;
      local_1440 = (float)local_13e0 + (float)local_13a0._0_4_;
      fStack_143c = local_13e0._4_4_ + (float)local_13a0._4_4_;
      fStack_1438 = (float)uStack_13d8 + (float)uStack_af8;
      fStack_1434 = uStack_13d8._4_4_ + uStack_af8._4_4_;
      fStack_1430 = (float)uStack_13d0 + (float)uStack_af0 * 1.0;
      fStack_142c = uStack_13d0._4_4_ + uStack_af0._4_4_ * 1.0;
      fStack_1428 = (float)uStack_13c8 + (float)uStack_ae8 * 1.0;
      fStack_1424 = uStack_13c8._4_4_ + 1.0;
      auVar3._16_8_ = auStack_f50._0_8_;
      auVar3._0_16_ = local_f60;
      auVar3._24_8_ = auStack_f50._8_8_;
      auVar5._4_4_ = fStack_143c;
      auVar5._0_4_ = local_1440;
      auVar5._8_4_ = fStack_1438;
      auVar5._12_4_ = fStack_1434;
      auVar5._16_4_ = fStack_1430;
      auVar5._20_4_ = fStack_142c;
      auVar5._24_4_ = fStack_1428;
      auVar5._28_4_ = fStack_1424;
      auVar5 = vdivps_avx(auVar3,auVar5);
      local_11a8 = local_1500;
      local_15c0 = auVar5._0_8_;
      local_11e0 = local_15c0;
      uStack_15b8 = auVar5._8_8_;
      uStack_11d8 = uStack_15b8;
      uStack_15b0 = auVar5._16_8_;
      uStack_11d0 = uStack_15b0;
      uStack_15a8 = auVar5._24_8_;
      uStack_11c8 = uStack_15a8;
      *(undefined8 *)*local_1500 = local_15c0;
      *(undefined8 *)(*local_1500 + 8) = uStack_15b8;
      *(undefined8 *)(*local_1500 + 0x10) = uStack_15b0;
      *(undefined8 *)(*local_1500 + 0x18) = uStack_15a8;
      local_1500 = local_1500 + 1;
      local_13e0 = local_1420;
      uStack_13d8 = uStack_1418;
      uStack_13d0 = uStack_1410;
      uStack_13c8 = uStack_1408;
      _local_13a0 = auVar4;
      _local_1300 = auVar12;
      local_12e0 = ZEXT1632(auVar6);
      local_1280 = uVar7;
      uStack_1278 = uVar8;
      local_c60 = local_e40;
      uStack_c58 = uStack_e38;
      uStack_c50 = uStack_e30;
      uStack_c48 = uStack_e28;
      local_b00 = local_8e0._0_8_;
      uStack_af8 = local_8e0._8_8_;
      uStack_af0 = local_8f0._0_8_;
      uStack_ae8 = local_8f0._8_8_;
      local_aa0 = local_ac0;
      uStack_a98 = uStack_ab8;
      uStack_a90 = uStack_ab0;
      uStack_a88 = uStack_aa8;
      local_a80 = local_1320._0_8_;
      uStack_a78 = local_1320._8_8_;
      uStack_a70 = local_1320._16_8_;
      uStack_a68 = local_1320._24_8_;
    }
    local_1184 = 0x3f800000;
    local_11a0 = 0x3f800000;
    uStack_119c = 0x3f800000;
    uStack_1198 = 0x3f800000;
    uStack_1194 = 0x3f800000;
    local_1180._8_8_ = SUB168(ZEXT816(0),4);
    for (; local_1480 = ZEXT832(0) << 0x20, auVar1 = ZEXT816(0) << 0x20, local_f90 = local_1498,
        local_1528 = local_ff0, local_1558 + 3 < local_14f0; local_1558 = local_1558 + 4) {
      local_1168 = local_1500;
      local_1030 = *(undefined8 *)*local_1500;
      uStack_1028 = *(undefined8 *)(*local_1500 + 8);
      local_1020 = 0;
      uStack_1018 = local_1180._8_8_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_1180._8_8_;
      auVar1 = vsubps_avx(auVar43 << 0x40,*(undefined1 (*) [16])*local_1500);
      local_10a0 = ZEXT816(0) << 0x20;
      local_10f0 = 0x3f8000003f800000;
      uStack_10e8 = 0x3f8000003f800000;
      local_10b0._0_8_ = auVar1._0_8_;
      local_440 = local_10b0._0_8_;
      local_10b0._8_8_ = auVar1._8_8_;
      uStack_438 = local_10b0._8_8_;
      local_450 = 0x42b0c0a542b0c0a5;
      uStack_448 = 0x42b0c0a542b0c0a5;
      auVar28._8_8_ = 0x42b0c0a542b0c0a5;
      auVar28._0_8_ = 0x42b0c0a542b0c0a5;
      auVar1 = vminps_avx(auVar1,auVar28);
      local_10b0._0_8_ = auVar1._0_8_;
      local_420 = local_10b0._0_8_;
      local_10b0._8_8_ = auVar1._8_8_;
      uStack_418 = local_10b0._8_8_;
      local_430 = 0xc2b0c0a5c2b0c0a5;
      uStack_428 = 0xc2b0c0a5c2b0c0a5;
      auVar29._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar29._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2 = vmaxps_avx(auVar1,auVar29);
      local_10b0._0_8_ = auVar2._0_8_;
      uVar7 = local_10b0._0_8_;
      local_10b0._8_8_ = auVar2._8_8_;
      uVar8 = local_10b0._8_8_;
      local_3d0 = 0x3fb8aa3b3fb8aa3b;
      uStack_3c8 = 0x3fb8aa3b3fb8aa3b;
      local_3c0._0_4_ = auVar2._0_4_;
      local_3c0._4_4_ = auVar2._4_4_;
      uStack_3b8._0_4_ = auVar2._8_4_;
      uStack_3b8._4_4_ = auVar2._12_4_;
      local_10d0._4_4_ = local_3c0._4_4_ * 1.442695;
      local_10d0._0_4_ = (float)local_3c0 * 1.442695;
      uStack_10c8._0_4_ = (float)uStack_3b8 * 1.442695;
      uStack_10c8._4_4_ = uStack_3b8._4_4_ * 1.442695;
      local_1060 = local_10d0;
      uStack_1058 = uStack_10c8;
      local_1070 = 0x3f0000003f000000;
      uStack_1068 = 0x3f0000003f000000;
      local_10d0._0_4_ = (float)local_3c0 * 1.442695 + 0.5;
      local_10d0._4_4_ = local_3c0._4_4_ * 1.442695 + 0.5;
      fVar45 = (float)uStack_3b8 * 1.442695 + 0.5;
      fVar46 = uStack_3b8._4_4_ * 1.442695 + 0.5;
      uStack_10c8._0_4_ = fVar45;
      uStack_10c8._4_4_ = fVar46;
      local_3a0 = local_10d0;
      uStack_398 = uStack_10c8;
      local_10e0._4_4_ = (int)(float)local_10d0._4_4_;
      local_10e0._0_4_ = (int)(float)local_10d0._0_4_;
      local_10e0._8_4_ = (int)fVar45;
      local_10e0._12_4_ = (int)fVar46;
      local_390 = local_10e0._0_8_;
      uStack_388 = local_10e0._8_8_;
      auVar30._8_8_ = local_10e0._8_8_;
      auVar30._0_8_ = local_10e0._0_8_;
      auVar6 = vcvtdq2ps_avx(auVar30);
      local_10c0 = auVar6._0_8_;
      local_370 = local_10c0;
      uStack_10b8 = auVar6._8_8_;
      uStack_368 = uStack_10b8;
      local_380 = local_10d0;
      uStack_378 = uStack_10c8;
      auVar31._8_8_ = uStack_10c8;
      auVar31._0_8_ = local_10d0;
      auVar1 = vcmpps_avx(auVar31,auVar6,1);
      local_1100._0_8_ = auVar1._0_8_;
      local_350 = local_1100._0_8_;
      local_1100._8_8_ = auVar1._8_8_;
      uStack_348 = local_1100._8_8_;
      local_360 = 0x3f8000003f800000;
      uStack_358 = 0x3f8000003f800000;
      auVar32._8_8_ = 0x3f8000003f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      local_1100 = vpand_avx(auVar1,auVar32);
      local_1040 = local_10c0;
      uStack_1038 = uStack_10b8;
      local_1050 = local_1100._0_8_;
      uStack_1048 = local_1100._8_8_;
      _local_10d0 = vsubps_avx(auVar6,local_1100);
      local_2f0 = local_10d0;
      uStack_2e8 = uStack_10c8;
      local_310 = local_10b0._0_8_;
      uStack_308 = local_10b0._8_8_;
      local_300 = 0x3f3180003f318000;
      uStack_2f8 = 0x3f3180003f318000;
      local_190 = local_10d0;
      uStack_188 = uStack_10c8;
      local_1a0 = 0x3f3180003f318000;
      uStack_198 = 0x3f3180003f318000;
      local_1b0 = local_10b0._0_8_;
      uStack_1a8 = local_10b0._8_8_;
      auVar33._8_8_ = 0x3f3180003f318000;
      auVar33._0_8_ = 0x3f3180003f318000;
      auVar1 = vfnmadd213ps_fma(auVar33,_local_10d0,auVar2);
      local_320 = local_10d0;
      uStack_318 = uStack_10c8;
      local_10b0._0_8_ = auVar1._0_8_;
      local_340 = local_10b0._0_8_;
      local_10b0._8_8_ = auVar1._8_8_;
      uStack_338 = local_10b0._8_8_;
      local_330 = 0xb95e8083b95e8083;
      uStack_328 = 0xb95e8083b95e8083;
      local_160 = local_10d0;
      uStack_158 = uStack_10c8;
      local_170 = 0xb95e8083b95e8083;
      uStack_168 = 0xb95e8083b95e8083;
      local_180 = local_10b0._0_8_;
      uStack_178 = local_10b0._8_8_;
      auVar34._8_8_ = 0xb95e8083b95e8083;
      auVar34._0_8_ = 0xb95e8083b95e8083;
      local_10b0 = vfnmadd213ps_fma(auVar34,_local_10d0,auVar1);
      local_3f0 = local_10b0._0_8_;
      uStack_3e8 = local_10b0._8_8_;
      local_3e0._0_4_ = local_10b0._0_4_;
      local_3e0._4_4_ = local_10b0._4_4_;
      uStack_3d8._0_4_ = local_10b0._8_4_;
      uStack_3d8._4_4_ = local_10b0._12_4_;
      local_10c0 = CONCAT44(local_3e0._4_4_ * local_3e0._4_4_,(float)local_3e0 * (float)local_3e0);
      uStack_10b8._0_4_ = (float)uStack_3d8 * (float)uStack_3d8;
      uStack_10b8._4_4_ = uStack_3d8._4_4_ * uStack_3d8._4_4_;
      local_1d0 = 0x3950696739506967;
      uStack_1c8 = 0x3950696739506967;
      local_1e0 = local_10b0._0_8_;
      uStack_1d8 = local_10b0._8_8_;
      local_1f0 = 0x3ab743ce3ab743ce;
      uStack_1e8 = 0x3ab743ce3ab743ce;
      local_130 = 0x3950696739506967;
      uStack_128 = 0x3950696739506967;
      local_140 = local_10b0._0_8_;
      uStack_138 = local_10b0._8_8_;
      local_150 = 0x3ab743ce3ab743ce;
      uStack_148 = 0x3ab743ce3ab743ce;
      auVar36._8_8_ = 0x3950696739506967;
      auVar36._0_8_ = 0x3950696739506967;
      auVar35._8_8_ = 0x3ab743ce3ab743ce;
      auVar35._0_8_ = 0x3ab743ce3ab743ce;
      auVar1 = vfmadd213ps_fma(local_10b0,auVar36,auVar35);
      local_1110 = auVar1._0_8_;
      local_200 = local_1110;
      uStack_1108 = auVar1._8_8_;
      uStack_1f8 = uStack_1108;
      local_210 = local_10b0._0_8_;
      uStack_208 = local_10b0._8_8_;
      local_220 = 0x3c0889083c088908;
      uStack_218 = 0x3c0889083c088908;
      local_100 = local_1110;
      uStack_f8 = uStack_1108;
      local_110 = local_10b0._0_8_;
      uStack_108 = local_10b0._8_8_;
      local_120 = 0x3c0889083c088908;
      uStack_118 = 0x3c0889083c088908;
      auVar37._8_8_ = 0x3c0889083c088908;
      auVar37._0_8_ = 0x3c0889083c088908;
      auVar1 = vfmadd213ps_fma(local_10b0,auVar1,auVar37);
      local_1110 = auVar1._0_8_;
      local_230 = local_1110;
      uStack_1108 = auVar1._8_8_;
      uStack_228 = uStack_1108;
      local_240 = local_10b0._0_8_;
      uStack_238 = local_10b0._8_8_;
      local_250 = 0x3d2aa9c13d2aa9c1;
      uStack_248 = 0x3d2aa9c13d2aa9c1;
      local_d0 = local_1110;
      uStack_c8 = uStack_1108;
      local_e0 = local_10b0._0_8_;
      uStack_d8 = local_10b0._8_8_;
      local_f0 = 0x3d2aa9c13d2aa9c1;
      uStack_e8 = 0x3d2aa9c13d2aa9c1;
      auVar38._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar38._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar1 = vfmadd213ps_fma(local_10b0,auVar1,auVar38);
      local_1110 = auVar1._0_8_;
      local_260 = local_1110;
      uStack_1108 = auVar1._8_8_;
      uStack_258 = uStack_1108;
      local_270 = local_10b0._0_8_;
      uStack_268 = local_10b0._8_8_;
      local_280 = 0x3e2aaaaa3e2aaaaa;
      uStack_278 = 0x3e2aaaaa3e2aaaaa;
      local_a0 = local_1110;
      uStack_98 = uStack_1108;
      local_b0 = local_10b0._0_8_;
      uStack_a8 = local_10b0._8_8_;
      local_c0 = 0x3e2aaaaa3e2aaaaa;
      uStack_b8 = 0x3e2aaaaa3e2aaaaa;
      auVar39._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar39._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar1 = vfmadd213ps_fma(local_10b0,auVar1,auVar39);
      local_1110 = auVar1._0_8_;
      local_290 = local_1110;
      uStack_1108 = auVar1._8_8_;
      uStack_288 = uStack_1108;
      local_2a0 = local_10b0._0_8_;
      uStack_298 = local_10b0._8_8_;
      local_70 = local_1110;
      uStack_68 = uStack_1108;
      local_80 = local_10b0._0_8_;
      uStack_78 = local_10b0._8_8_;
      local_90 = 0x3f0000003f000000;
      uStack_88 = 0x3f0000003f000000;
      auVar40._8_8_ = 0x3f0000003f000000;
      auVar40._0_8_ = 0x3f0000003f000000;
      auVar1 = vfmadd213ps_fma(local_10b0,auVar1,auVar40);
      local_1110 = auVar1._0_8_;
      local_2c0 = local_1110;
      uStack_1108 = auVar1._8_8_;
      uStack_2b8 = uStack_1108;
      local_2d0 = local_10c0;
      uStack_2c8 = uStack_10b8;
      local_2e0 = local_10b0._0_8_;
      uStack_2d8 = local_10b0._8_8_;
      local_40 = local_1110;
      uStack_38 = uStack_1108;
      local_50 = local_10c0;
      uStack_48 = uStack_10b8;
      local_60 = local_10b0._0_8_;
      uStack_58 = local_10b0._8_8_;
      auVar41._8_8_ = uStack_10b8;
      auVar41._0_8_ = local_10c0;
      auVar1 = vfmadd213ps_fma(auVar41,auVar1,local_10b0);
      local_1110 = auVar1._0_8_;
      uVar9 = local_1110;
      uStack_1108 = auVar1._8_8_;
      uVar10 = uStack_1108;
      local_1090 = 0x3f8000003f800000;
      uStack_1088 = 0x3f8000003f800000;
      local_1080._0_4_ = auVar1._0_4_;
      local_1080._4_4_ = auVar1._4_4_;
      uStack_1078._0_4_ = auVar1._8_4_;
      uStack_1078._4_4_ = auVar1._12_4_;
      local_1110._4_4_ = local_1080._4_4_ + 1.0;
      local_1110._0_4_ = (float)local_1080 + 1.0;
      uStack_1108._0_4_ = (float)uStack_1078 + 1.0;
      uStack_1108._4_4_ = uStack_1078._4_4_ + 1.0;
      local_3b0._0_4_ = local_10d0._0_4_;
      local_3b0._4_4_ = local_10d0._4_4_;
      uStack_3a8._0_4_ = local_10d0._8_4_;
      uStack_3a8._4_4_ = local_10d0._12_4_;
      local_10e0._4_4_ = (int)local_3b0._4_4_;
      local_10e0._0_4_ = (int)(float)local_3b0;
      local_10e0._8_4_ = (int)(float)uStack_3a8;
      local_10e0._12_4_ = (int)uStack_3a8._4_4_;
      local_4c0 = local_10e0._0_8_;
      uStack_4b8 = local_10e0._8_8_;
      local_4d0 = 0x7f0000007f;
      uStack_4c8 = 0x7f0000007f;
      auVar27._8_8_ = local_10e0._8_8_;
      auVar27._0_8_ = local_10e0._0_8_;
      auVar26._8_8_ = 0x7f0000007f;
      auVar26._0_8_ = 0x7f0000007f;
      auVar1 = vpaddd_avx(auVar27,auVar26);
      local_10e0._0_8_ = auVar1._0_8_;
      local_460 = local_10e0._0_8_;
      local_10e0._8_8_ = auVar1._8_8_;
      uStack_458 = local_10e0._8_8_;
      local_464 = 0x17;
      local_10e0 = vpslld_avx(auVar1,ZEXT416(0x17));
      local_1c0 = local_10e0._0_8_;
      uStack_1b8 = local_10e0._8_8_;
      local_1120 = local_10e0._0_8_;
      uStack_1118 = local_10e0._8_8_;
      local_400 = _local_1110;
      local_410._0_4_ = local_10e0._0_4_;
      local_410._4_4_ = local_10e0._4_4_;
      uStack_408._0_4_ = local_10e0._8_4_;
      uStack_408._4_4_ = local_10e0._12_4_;
      local_1110._0_4_ = ((float)local_1080 + 1.0) * (float)local_410;
      local_1110._4_4_ = (local_1080._4_4_ + 1.0) * local_410._4_4_;
      uStack_408._0_4_ = ((float)uStack_1078 + 1.0) * (float)uStack_408;
      uStack_408._4_4_ = (uStack_1078._4_4_ + 1.0) * uStack_408._4_4_;
      uStack_1108._0_4_ = (float)uStack_408;
      uStack_1108._4_4_ = uStack_408._4_4_;
      local_1140 = local_1110;
      uStack_1138 = uStack_1108;
      local_1160 = (float)local_1110._0_4_ + 1.0;
      fStack_115c = (float)local_1110._4_4_ + 1.0;
      fStack_1158 = (float)uStack_408 + 1.0;
      fStack_1154 = uStack_408._4_4_ + 1.0;
      auVar11._8_8_ = 0x3f8000003f800000;
      auVar11._0_8_ = 0x3f8000003f800000;
      auVar6._4_4_ = fStack_115c;
      auVar6._0_4_ = local_1160;
      auVar6._8_4_ = fStack_1158;
      auVar6._12_4_ = fStack_1154;
      auVar1 = vdivps_avx(auVar11,auVar6);
      local_ff8 = local_1500;
      local_15f0 = auVar1._0_8_;
      local_1010 = local_15f0;
      uStack_15e8 = auVar1._8_8_;
      uStack_1008 = uStack_15e8;
      *(undefined8 *)*local_1500 = local_15f0;
      *(undefined8 *)(*local_1500 + 8) = uStack_15e8;
      local_1500 = (undefined1 (*) [32])(*local_1500 + 0x10);
      local_1150 = 0x3f8000003f800000;
      uStack_1148 = 0x3f8000003f800000;
      local_1130 = 0x3f8000003f800000;
      uStack_1128 = 0x3f8000003f800000;
      local_1080 = uVar9;
      uStack_1078 = uVar10;
      local_410 = local_10e0._0_8_;
      uStack_408 = local_10e0._8_8_;
      local_3e0 = local_3f0;
      uStack_3d8 = uStack_3e8;
      local_3c0 = uVar7;
      uStack_3b8 = uVar8;
      local_3b0 = local_10d0;
      uStack_3a8 = uStack_10c8;
      local_2b0 = local_1070;
      uStack_2a8 = uStack_1068;
    }
    for (; local_1180 = auVar1, local_1558 < local_14f0; local_1558 = local_1558 + 1) {
      dVar44 = std::exp((double)(ulong)(*(uint *)*local_1500 ^ 0x80000000));
      *(float *)*local_1500 = 1.0 / (SUB84(dVar44,0) + 1.0);
      local_1500 = (undefined1 (*) [32])(*local_1500 + 4);
      auVar1 = local_1180;
    }
  }
  return 0;
}

Assistant:

int Sigmoid_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_one_avx512, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_one_avx, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_one, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}